

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void prvTidyInitTags(TidyDocImpl *doc)

{
  Dict *pDVar1;
  
  memset(&doc->tags,0,0x5a0);
  pDVar1 = (Dict *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x40);
  pDVar1->id = TidyTag_UNKNOWN;
  pDVar1->name = (tmbstr)0x0;
  pDVar1->next = (Dict *)0x0;
  pDVar1->versions = 0x10000;
  pDVar1->model = 8;
  pDVar1->attrvers = (AttrVersion *)0x0;
  pDVar1->parser = (Parser *)0x0;
  pDVar1->chkattrs = (CheckAttribs *)0x0;
  (doc->tags).xml_tags = pDVar1;
  return;
}

Assistant:

void TY_(InitTags)( TidyDocImpl* doc )
{
    Dict* xml;
    TidyTagImpl* tags = &doc->tags;

    TidyClearMemory( tags, sizeof(TidyTagImpl) );

    /* create dummy entry for all xml tags */
    xml =  NewDict( doc, NULL );
    xml->versions = VERS_XML;
    xml->model = CM_BLOCK;
    xml->parser = 0;
    xml->chkattrs = 0;
    xml->attrvers = NULL;
    tags->xml_tags = xml;
}